

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec7TruthShrink(word *uTruth,int nVars,int nVarsAll,uint Phase)

{
  int local_28;
  int local_24;
  int Var;
  int k;
  int i;
  uint Phase_local;
  int nVarsAll_local;
  int nVars_local;
  word *uTruth_local;
  
  local_28 = 0;
  if (7 < nVarsAll) {
    __assert_fail("nVarsAll <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x216,"void If_Dec7TruthShrink(word *, int, int, unsigned int)");
  }
  for (Var = 0; Var < nVarsAll; Var = Var + 1) {
    local_24 = Var;
    if ((Phase & 1 << ((byte)Var & 0x1f)) != 0) {
      while (local_24 = local_24 + -1, local_28 <= local_24) {
        If_Dec7SwapAdjacent(uTruth,local_24);
      }
      local_28 = local_28 + 1;
    }
  }
  if (local_28 != nVars) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x21e,"void If_Dec7TruthShrink(word *, int, int, unsigned int)");
  }
  return;
}

Assistant:

static inline void If_Dec7TruthShrink( word uTruth[2], int nVars, int nVarsAll, unsigned Phase )
{
    int i, k, Var = 0;
    assert( nVarsAll <= 7 );
    for ( i = 0; i < nVarsAll; i++ )
        if ( Phase & (1 << i) )
        {
            for ( k = i-1; k >= Var; k-- )
                If_Dec7SwapAdjacent( uTruth, k );
            Var++;
        }
    assert( Var == nVars );
}